

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qobject.cpp
# Opt level: O1

void QObject::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  undefined8 *puVar2;
  QArrayData *data;
  char16_t *pcVar3;
  undefined8 *puVar4;
  QObject *pQVar5;
  int iVar6;
  QObject *parent;
  long in_FS_OFFSET;
  QUntypedBindable QVar7;
  undefined8 local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
switchD_002bcfcf_caseD_0:
    switch(_id) {
    case 0:
      local_60 = *_a[1];
      goto LAB_002bd114;
    case 1:
      local_60 = 0;
LAB_002bd114:
      local_58.d.ptr = (char16_t *)&local_60;
      iVar6 = 0;
LAB_002bd124:
      local_58.d.d = (Data *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar6,(void **)&local_58);
      break;
    case 2:
      local_58.d.ptr = (char16_t *)_a[1];
      local_58.d.size = (qsizetype)&local_60;
      iVar6 = 2;
      goto LAB_002bd124;
    case 3:
      deleteLater(_o);
    }
    if (_c == ReadProperty) {
switchD_002bcfcf_caseD_1:
      if (_id == 0) {
        puVar2 = (undefined8 *)*_a;
        objectName(&local_58,_o);
        data = (QArrayData *)*puVar2;
        pcVar3 = (char16_t *)puVar2[1];
        *puVar2 = local_58.d.d;
        puVar2[1] = local_58.d.ptr;
        puVar4 = (undefined8 *)puVar2[2];
        puVar2[2] = local_58.d.size;
        local_58.d.d = (Data *)data;
        local_58.d.ptr = pcVar3;
        local_58.d.size = (qsizetype)puVar4;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,2,0x10);
          }
        }
      }
      if (_c == WriteProperty && _id == 0) {
LAB_002bd199:
        doSetObjectName(_o,(QString *)*_a);
      }
    }
    else if (_c == WriteProperty) {
switchD_002bcfcf_caseD_2:
      if (_id == 0) goto LAB_002bd199;
    }
    else if (_c == IndexOfMethod) {
switchD_002bcfcf_caseD_5:
      plVar1 = (long *)_a[1];
      if (((code *)*plVar1 == destroyed) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto LAB_002bd1bf;
      }
      if (((code *)*plVar1 == objectNameChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto LAB_002bd1bf;
      }
      if (_c == WriteProperty) goto switchD_002bcfcf_caseD_2;
      if (_c == ReadProperty) goto switchD_002bcfcf_caseD_1;
    }
    break;
  case ReadProperty:
    goto switchD_002bcfcf_caseD_1;
  case WriteProperty:
    goto switchD_002bcfcf_caseD_2;
  case CreateInstance:
    if (_id == 1) {
      pQVar5 = (QObject *)operator_new(0x10);
      QObject(pQVar5,(QObject *)0x0);
LAB_002bd056:
      if ((undefined8 *)*_a != (undefined8 *)0x0) {
        *(QObject **)*_a = pQVar5;
      }
    }
    else if (_id == 0) {
      pQVar5 = (QObject *)operator_new(0x10);
      QObject(pQVar5,*_a[1]);
      goto LAB_002bd056;
    }
    switch(_c) {
    case InvokeMetaMethod:
      goto switchD_002bcfcf_caseD_0;
    case ReadProperty:
      goto switchD_002bcfcf_caseD_1;
    case WriteProperty:
      goto switchD_002bcfcf_caseD_2;
    case IndexOfMethod:
      goto switchD_002bcfcf_caseD_5;
    case ConstructInPlace:
      goto switchD_002bcfcf_caseD_a;
    }
    break;
  case IndexOfMethod:
    goto switchD_002bcfcf_caseD_5;
  case ConstructInPlace:
switchD_002bcfcf_caseD_a:
    if (_id == 1) {
      pQVar5 = (QObject *)*_a;
      parent = (QObject *)0x0;
LAB_002bd096:
      QObject(pQVar5,parent);
    }
    else if (_id == 0) {
      pQVar5 = (QObject *)*_a;
      parent = *_a[1];
      goto LAB_002bd096;
    }
    switch(_c) {
    case InvokeMetaMethod:
      goto switchD_002bcfcf_caseD_0;
    case ReadProperty:
      goto switchD_002bcfcf_caseD_1;
    case WriteProperty:
      goto switchD_002bcfcf_caseD_2;
    case IndexOfMethod:
      goto switchD_002bcfcf_caseD_5;
    }
  }
  if (_c == BindableProperty && _id == 0) {
    QVar7 = (QUntypedBindable)bindableObjectName(_o);
    *(QUntypedBindable *)*_a = QVar7;
  }
LAB_002bd1bf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QObject::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QObject *>(_o);
    if (_c == QMetaObject::CreateInstance) {
        switch (_id) {
        case 0: { QObject *_r = new QObject((*reinterpret_cast<std::add_pointer_t<QObject*>>(_a[1])));
            if (_a[0]) *reinterpret_cast<QObject**>(_a[0]) = _r; } break;
        case 1: { QObject *_r = new QObject();
            if (_a[0]) *reinterpret_cast<QObject**>(_a[0]) = _r; } break;
        default: break;
        }
    }
    if (_c == QMetaObject::ConstructInPlace) {
        switch (_id) {
        case 0: { new (_a[0]) QObject((*reinterpret_cast<std::add_pointer_t<QObject*>>(_a[1]))); } break;
        case 1: { new (_a[0]) QObject(); } break;
        default: break;
        }
    }
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->destroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        case 1: _t->destroyed(); break;
        case 2: _t->objectNameChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])), QPrivateSignal()); break;
        case 3: _t->deleteLater(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QObject::*)(QObject * )>(_a, &QObject::destroyed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QObject::*)(const QString & , QPrivateSignal)>(_a, &QObject::objectNameChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->objectName(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setObjectName(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableObjectName(); break;
        default: break;
        }
    }
}